

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::addMatrixUniform
          (ShaderMatrixInstance *this,deUint32 bindingLocation,DataType dataType,float *dataPtr)

{
  int row_2;
  undefined8 *puVar1;
  int col;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  Mat3 matrix;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  puVar1 = &local_88;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  (*(code *)(&DAT_00af08a8 + *(int *)(&DAT_00af08a8 + (ulong)(dataType - TYPE_FLOAT_MAT2) * 4)))
            (this,bindingLocation,
             &DAT_00af08a8 + *(int *)(&DAT_00af08a8 + (ulong)(dataType - TYPE_FLOAT_MAT2) * 4));
  return;
}

Assistant:

void ShaderMatrixInstance::addMatrixUniform(deUint32 bindingLocation, DataType dataType, const float *dataPtr)
{
	Mat4			result;
	const size_t	matrixSize = sizeof(float) * 4 * 4;

	switch(dataType)
	{
		case TYPE_FLOAT_MAT2:
		{
			Mat2 matrix = Mat2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT2X3:
		{
			Mat2x3 matrix = Mat2x3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT2X4:
		{
			Mat2x4 matrix = Mat2x4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3X2:
		{
			Mat3x2 matrix = Mat3x2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3:
		{
			Mat3 matrix = Mat3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT3X4:
		{
			Mat3x4 matrix = Mat3x4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4X2:
		{
			Mat4x2 matrix = Mat4x2(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4X3:
		{
			Mat4x3 matrix = Mat4x3(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		case TYPE_FLOAT_MAT4:
		{
			Mat4 matrix = Mat4(dataPtr);
			result.setColumn(0, matrix.getColumn(0).toWidth<4>());
			result.setColumn(1, matrix.getColumn(1).toWidth<4>());
			result.setColumn(2, matrix.getColumn(2).toWidth<4>());
			result.setColumn(3, matrix.getColumn(3).toWidth<4>());
			break;
		}
		default:
			DE_ASSERT(false);
			break;
	}

	addUniform(bindingLocation, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, matrixSize, result.getColumnMajorData().getPtr());
}